

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketUtils.cpp
# Opt level: O2

ssize_t readn(int fd,void *buff,size_t n)

{
  long lVar1;
  int *piVar2;
  size_t __nbytes;
  
  __nbytes = n;
  do {
    if (__nbytes == 0) {
LAB_00126e77:
      return n - __nbytes;
    }
    lVar1 = read(fd,buff,__nbytes);
    if (lVar1 < 0) {
      piVar2 = __errno_location();
      if (*piVar2 != 4) {
        if (*piVar2 != 0xb) {
          return -1;
        }
        goto LAB_00126e77;
      }
      lVar1 = 0;
    }
    else if (lVar1 == 0) goto LAB_00126e77;
    __nbytes = __nbytes - lVar1;
    buff = (void *)((long)buff + lVar1);
  } while( true );
}

Assistant:

ssize_t readn(int fd, void* buff, size_t n) {
    size_t nleft = n;
    ssize_t nread = 0;
    char* buf = (char*)buff;
    
    while (nleft > 0) {
        if ((nread = read(fd, buf, nleft)) < 0) {
            if (errno == EINTR) {
                nread = 0;
            } else if (errno == EAGAIN) {
                break;
            } else {
                return -1;   
            }
        } else if (nread == 0) {
            break;
        }
        
        nleft -= nread;
        buf += nread;
    }
    return n - nleft;
}